

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

void list_push_back(list *list,list_elem *e)

{
  list_elem *e_local;
  list *list_local;
  
  if (list->tail == (list_elem *)0x0) {
    list->head = e;
    list->tail = e;
    e->prev = (list_elem *)0x0;
    e->next = (list_elem *)0x0;
  }
  else {
    list->tail->next = e;
    e->prev = list->tail;
    e->next = (list_elem *)0x0;
    list->tail = e;
  }
  return;
}

Assistant:

void list_push_back(struct list *list, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    if (list->tail == NULL) {
        list->head = e;
        list->tail = e;
        e->next = e->prev = NULL;
    }else{
        list->tail->next = e;
        e->prev = list->tail;
        e->next = NULL;
        list->tail = e;
    }
    IFDEF_LOCK( spin_unlock(&list->lock); );
}